

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O0

void GraphBase::format_graph(string *filename,string *mode)

{
  allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  *paVar1;
  allocator<unsigned_long> *this;
  size_t sVar2;
  float fVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  istream *piVar8;
  reference pvVar9;
  size_type sVar10;
  reference pvVar11;
  reference this_00;
  reference pvVar12;
  ostream *this_01;
  ulong uVar13;
  float local_4e4;
  float local_4d4;
  bool local_419;
  string local_418;
  string local_3f8;
  ulong local_3d8;
  size_t j;
  size_t i_1;
  pair<unsigned_int,_float> *nbr;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *__range3
  ;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  iterator __end2;
  iterator __begin2;
  Graph *__range2;
  int idx;
  pair<unsigned_int,_float> local_378;
  ulong local_370;
  size_t i;
  undefined1 local_360 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecInDeg;
  undefined1 local_340 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecOutDeg;
  undefined1 local_320 [8];
  Graph vecGRev;
  undefined1 local_300 [8];
  Graph vecG;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  istream local_2a0 [8];
  ifstream infile;
  float local_94;
  uint local_90;
  float weight;
  uint32_t dstId;
  uint32_t srcId;
  size_t numE;
  size_t numV;
  allocator local_41;
  string local_40;
  bool local_1a;
  char local_19;
  bool cond;
  string *psStack_18;
  char m1;
  string *mode_local;
  string *filename_local;
  
  psStack_18 = mode;
  mode_local = filename;
  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)mode);
  iVar6 = tolower((int)*pcVar7);
  local_19 = (char)iVar6;
  local_419 = local_19 == 'g' || local_19 == 'w';
  local_1a = local_419;
  if (local_19 != 'g' && local_19 != 'w') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"The input mode is not supported:",&local_41);
    std::__cxx11::string::string((string *)&numV,(string *)mode);
    LogInfo<std::__cxx11::string>
              (&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numV)
    ;
    std::__cxx11::string::~string((string *)&numV);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    LogInfo<char_const*>("The supported modes: -mode=g or -mode=w");
    LogInfo<char_const*>("g: graph only (default, using WC), w: with edge property");
  }
  local_94 = 0.0;
  std::ifstream::ifstream(local_2a0,(string *)filename,_S_in);
  bVar4 = std::ifstream::is_open();
  if ((bVar4 & 1) == 0) {
    std::operator+(&local_2e0,"The file \"",filename);
    std::operator+(&local_2c0,&local_2e0,"\" can NOT be opened\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    vecG.
    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    piVar8 = (istream *)std::istream::operator>>(local_2a0,&numE);
    std::istream::operator>>(piVar8,(ulong *)&dstId);
    sVar2 = numE;
    paVar1 = (allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
              *)((long)&vecGRev.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::
    allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
    ::allocator(paVar1);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              *)local_300,sVar2,paVar1);
    std::
    allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
    ::~allocator((allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                  *)((long)&vecGRev.
                            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar2 = numE;
    paVar1 = (allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
              *)((long)&vecOutDeg.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::
    allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
    ::allocator(paVar1);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              *)local_320,sVar2,paVar1);
    std::
    allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
    ::~allocator((allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                  *)((long)&vecOutDeg.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar2 = numE;
    this = (allocator<unsigned_long> *)
           ((long)&vecInDeg.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_long>::allocator(this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340,sVar2,this);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)
               ((long)&vecInDeg.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar2 = numE;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360,sVar2,
               (allocator<unsigned_long> *)((long)&i + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i + 7));
    local_370 = _dstId;
    while (uVar13 = local_370 - 1, local_370 != 0) {
      if (local_19 == 'w') {
        local_370 = uVar13;
        piVar8 = (istream *)std::istream::operator>>(local_2a0,(uint *)&weight);
        piVar8 = (istream *)std::istream::operator>>(piVar8,&local_90);
        std::istream::operator>>(piVar8,&local_94);
      }
      else {
        local_370 = uVar13;
        piVar8 = (istream *)std::istream::operator>>(local_2a0,(uint *)&weight);
        std::istream::operator>>(piVar8,&local_90);
      }
      pvVar9 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             *)local_300,(ulong)(uint)weight);
      std::pair<unsigned_int,_float>::pair<unsigned_int_&,_float_&,_true>
                (&local_378,&local_90,&local_94);
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::push_back(pvVar9,&local_378);
      pvVar9 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             *)local_320,(ulong)local_90);
      std::pair<unsigned_int,_float>::pair<unsigned_int_&,_float_&,_true>
                ((pair<unsigned_int,_float> *)&stack0xfffffffffffffc80,(uint *)&weight,&local_94);
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::push_back(pvVar9,(value_type *)&stack0xfffffffffffffc80);
    }
    local_370 = uVar13;
    std::ifstream::close();
    for (__range2._4_4_ = 0; (ulong)(long)__range2._4_4_ < numE; __range2._4_4_ = __range2._4_4_ + 1
        ) {
      pvVar9 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             *)local_300,(long)__range2._4_4_);
      sVar10 = std::
               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ::size(pvVar9);
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340,
                           (long)__range2._4_4_);
      *pvVar11 = sVar10;
      pvVar9 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             *)local_320,(long)__range2._4_4_);
      sVar10 = std::
               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ::size(pvVar9);
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360,
                           (long)__range2._4_4_);
      *pvVar11 = sVar10;
    }
    if (local_19 == 'g') {
      __end2 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::begin((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        *)local_300);
      nbrs = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              *)std::
                vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                ::end((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       *)local_300);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                                         *)&nbrs), bVar5) {
        this_00 = __gnu_cxx::
                  __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                  ::operator*(&__end2);
        __end3 = std::
                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ::begin(this_00);
        nbr = (pair<unsigned_int,_float> *)
              std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::end(this_00);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                           *)&nbr), bVar5) {
          i_1 = (size_t)__gnu_cxx::
                        __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                        ::operator*(&__end3);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360,
                               (ulong)((reference)i_1)->first);
          local_4d4 = (float)*pvVar11;
          *(float *)(i_1 + 4) = 1.0 / local_4d4;
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&__end3);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
        ::operator++(&__end2);
      }
      for (j = 0; sVar2 = j,
          sVar10 = std::
                   vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           *)local_320), sVar2 < sVar10; j = j + 1) {
        pvVar9 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                               *)local_320,j);
        sVar10 = std::
                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ::size(pvVar9);
        if (sVar10 != 0) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360,j)
          ;
          local_4e4 = (float)*pvVar11;
          local_94 = 1.0 / local_4e4;
          local_3d8 = 0;
          while( true ) {
            uVar13 = local_3d8;
            pvVar9 = std::
                     vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                   *)local_320,j);
            sVar10 = std::
                     vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ::size(pvVar9);
            fVar3 = local_94;
            if (sVar10 <= uVar13) break;
            pvVar9 = std::
                     vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                   *)local_320,j);
            pvVar12 = std::
                      vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ::operator[](pvVar9,local_3d8);
            pvVar12->second = fVar3;
            local_3d8 = local_3d8 + 1;
          }
        }
      }
    }
    std::__cxx11::string::string((string *)&local_3f8,(string *)filename);
    IOcontroller::save_graph_struct(&local_3f8,(Graph *)local_300,false);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::string((string *)&local_418,(string *)filename);
    IOcontroller::save_graph_struct(&local_418,(Graph *)local_320,true);
    std::__cxx11::string::~string((string *)&local_418);
    this_01 = std::operator<<((ostream *)&std::cout,"The graph is formatted!");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_360);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               *)local_320);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               *)local_300);
    vecG.
    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  std::ifstream::~ifstream(local_2a0);
  return;
}

Assistant:

static void format_graph(const std::string filename, const std::string mode)
    {
        const char m1 = tolower(mode[0]);
        const bool cond = m1 == 'g' || m1 == 'w';
        if (!cond)
        {
            LogInfo("The input mode is not supported:", mode);
            LogInfo("The supported modes: -mode=g or -mode=w");
            LogInfo("g: graph only (default, using WC), w: with edge property");
        }

        size_t numV, numE;
        uint32_t srcId, dstId;
        float weight = 0.0;
        std::ifstream infile(filename);
        if (!infile.is_open())
        {
            std::cout << "The file \"" + filename + "\" can NOT be opened\n";
            return;
        }
        infile >> numV >> numE;

        // FILE* fin;
        // const errno_t err = fopen_s(&fin, filename.c_str(), "r");
        // if (err != 0)
        // {
        // 	std::cout << "The file \"" + filename + "\" can NOT be opened\n";
        // 	return;
        // }
        // fscanf_s(fin, "%zu%zu", &numV, &numE);

        Graph vecG(numV);
        Graph vecGRev(numV);
        std::vector<size_t> vecOutDeg(numV);
        std::vector<size_t> vecInDeg(numV);
        for (auto i = numE; i--;)
        {
            if (m1 == 'w')
            {
                infile >> srcId >> dstId >> weight;
                // fscanf_s(fin, "%u%u%f", &srcId, &dstId, &weight);
            }
            else
            {
                infile >> srcId >> dstId;
                // fscanf_s(fin, "%u%u", &srcId, &dstId);
            }
            vecG[srcId].push_back(Edge(dstId, weight));
            vecGRev[dstId].push_back(Edge(srcId, weight));
        }
        infile.close();
        for (auto idx = 0; idx < numV; idx++)
        {
            vecOutDeg[idx] = vecG[idx].size();
            vecInDeg[idx] = vecGRev[idx].size();
        }
        if (m1 == 'g')
        {
            // When the input is a graph only, set the diffusion probability using WC setting
            for (auto& nbrs : vecG) {
                for (auto& nbr : nbrs) {
                    nbr.second = (float) 1.0 / vecInDeg[nbr.first];
                }
            }

            for (size_t i = 0; i < vecGRev.size(); i++){
                if (vecGRev[i].size() == 0) {
                    continue;
                }
                weight = (float) 1.0 / vecInDeg[i];
                for (size_t j = 0; j < vecGRev[i].size(); j++) {
                    vecGRev[i][j].second = weight;
                }
            }
            // The bug is found by sibo
            // auto idx = 0;
            // for (auto& inNbrs : vecGRev)
            // {
            //    if (inNbrs.empty()) continue; // Skip if there is no in-neighbor.
            //    weight = (float)1.0 / vecInDeg[idx++];
            //    for (auto& inNbr : inNbrs)
            //    {
            //        inNbr.second = weight;
            //    }
            // }
        }
        TIO::save_graph_struct(filename, vecG, false);
        TIO::save_graph_struct(filename, vecGRev, true);
        std::cout << "The graph is formatted!" << std::endl;
    }